

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O1

void Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32
               (uint32_t *st32,Lib_IntVector_Intrinsics_vec128 *st)

{
  longlong lVar1;
  
  lVar1 = (*st)[1];
  *(longlong *)st32 = (*st)[0];
  *(longlong *)(st32 + 2) = lVar1;
  lVar1 = st[1][1];
  *(longlong *)(st32 + 4) = st[1][0];
  *(longlong *)(st32 + 6) = lVar1;
  lVar1 = st[2][1];
  *(longlong *)(st32 + 8) = st[2][0];
  *(longlong *)(st32 + 10) = lVar1;
  lVar1 = st[3][1];
  *(longlong *)(st32 + 0xc) = st[3][0];
  *(longlong *)(st32 + 0xe) = lVar1;
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32(
  uint32_t *st32,
  Lib_IntVector_Intrinsics_vec128 *st
)
{
  Lib_IntVector_Intrinsics_vec128 *r0 = st;
  Lib_IntVector_Intrinsics_vec128 *r1 = st + 1U;
  Lib_IntVector_Intrinsics_vec128 *r2 = st + 2U;
  Lib_IntVector_Intrinsics_vec128 *r3 = st + 3U;
  uint32_t *b0 = st32;
  uint32_t *b1 = st32 + 4U;
  uint32_t *b2 = st32 + 8U;
  uint32_t *b3 = st32 + 12U;
  uint8_t b8[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b8, r0[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b0;
    uint8_t *bj = b8 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b80[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b80, r1[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b1;
    uint8_t *bj = b80 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b81[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b81, r2[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b2;
    uint8_t *bj = b81 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b82[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b82, r3[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b3;
    uint8_t *bj = b82 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
}